

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

int mctools_is_same_file(mcu8str *p1raw,mcu8str *p2raw)

{
  __dev_t __ptr;
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  char *__s2;
  mcu8str p1;
  mcu8str p2;
  mcu8str s_3;
  stat sinfo2;
  stat sinfo1;
  char buf [4096];
  mcu8str local_11a0;
  mcu8str local_1188;
  mcu8str local_1170;
  stat local_1158;
  stat local_10c8;
  char local_1038 [4104];
  
  pcVar3 = p1raw->c_str;
  uVar4 = p1raw->size;
  local_11a0.buflen = uVar4 + 1;
  local_11a0.owns_memory = 0;
  local_11a0.c_str = pcVar3;
  local_11a0.size = uVar4;
  iVar1 = mctools_impl_has_winnamespace(p1raw);
  if (iVar1 != 0) {
    pcVar3 = pcVar3 + 4;
    uVar4 = uVar4 - 4;
    local_11a0.c_str = pcVar3;
    local_11a0.size = uVar4;
  }
  __s2 = p2raw->c_str;
  uVar5 = p2raw->size;
  local_1188.buflen = uVar5 + 1;
  local_1188.owns_memory = 0;
  local_1188.c_str = __s2;
  local_1188.size = uVar5;
  iVar1 = mctools_impl_has_winnamespace(p2raw);
  if (iVar1 != 0) {
    __s2 = __s2 + 4;
    uVar5 = uVar5 - 4;
    local_1188.c_str = __s2;
    local_1188.size = uVar5;
  }
  if ((uVar4 == uVar5) && (iVar1 = bcmp(pcVar3,__s2,(ulong)uVar4), iVar1 == 0)) {
    iVar1 = mctools_is_file(&local_11a0);
    return iVar1;
  }
  local_1158.st_nlink._0_4_ = 0;
  local_1038[0] = '\0';
  local_1158.st_ino = 0x100000000000;
  local_1158.st_dev = (__dev_t)local_1038;
  mcu8str_assign((mcu8str *)&local_1158,&local_11a0);
  mctools_pathseps_platform((mcu8str *)&local_1158);
  __ptr = local_1158.st_dev;
  pFVar2 = fopen((char *)local_1158.st_dev,"rb");
  if ((char *)__ptr != (char *)0x0 && (int)local_1158.st_nlink != 0) {
    free((void *)__ptr);
  }
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = fileno(pFVar2);
    iVar1 = fstat(iVar1,&local_10c8);
    fclose(pFVar2);
    if (iVar1 == 0) {
      if ((local_10c8.st_mode & 0xf000) == 0x4000) {
        return 0;
      }
      local_1170.owns_memory = 0;
      local_1038[0] = '\0';
      local_1170.size = 0;
      local_1170.buflen = 0x1000;
      local_1170.c_str = local_1038;
      mcu8str_assign(&local_1170,&local_1188);
      mctools_pathseps_platform(&local_1170);
      pcVar3 = local_1170.c_str;
      pFVar2 = fopen(local_1170.c_str,"rb");
      if (pcVar3 != (char *)0x0 && local_1170.owns_memory != 0) {
        free(pcVar3);
      }
      if (pFVar2 == (FILE *)0x0) {
        return 0;
      }
      iVar1 = fileno(pFVar2);
      iVar1 = fstat(iVar1,&local_1158);
      fclose(pFVar2);
      if (iVar1 != 0) {
        return 0;
      }
      if ((local_1158.st_mode & 0xf000) == 0x4000) {
        return 0;
      }
      return (uint)(local_1158.st_ino == local_10c8.st_ino && local_10c8.st_dev == local_1158.st_dev
                   );
    }
  }
  return 0;
}

Assistant:

int mctools_is_same_file( const mcu8str* p1raw, const mcu8str* p2raw )
  {
    mcu8str p1 = mctools_impl_view_no_winnamespace(p1raw);
    mcu8str p2 = mctools_impl_view_no_winnamespace(p2raw);

    //First check for trivial string equality:
    if ( mcu8str_equal( &p1, &p2 ) )
      return mctools_is_file( &p1 );

#ifdef MC_IS_WINDOWS
    //Open files and query file information. Note that we try to keep both
    //handles open while querying info, for consistent results.
    mcwinstr wp1 = mc_path2wpath( &p1 );
    mcwinstr wp2 = mc_path2wpath( &p2 );

    DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    DWORD access = FILE_READ_ATTRIBUTES;
    DWORD flags = FILE_FLAG_BACKUP_SEMANTICS;
    HANDLE fh1 = CreateFileW( wp1.c_str,
                              access,
                              share,
                              NULL,
                              OPEN_EXISTING,
                              flags,
                              NULL );
    mc_winstr_dealloc( &wp1 );
    if ( fh1 == INVALID_HANDLE_VALUE ) {
      mc_winstr_dealloc( &wp2 );
      return 0;//failed
    }
    HANDLE fh2 = CreateFileW( wp2.c_str,
                              access,
                              share,
                              NULL,
                              OPEN_EXISTING,
                              flags,
                              NULL );
    mc_winstr_dealloc( &wp2 );
    if ( fh2 == INVALID_HANDLE_VALUE ) {
      CloseHandle( fh1 );
      return 0;//failed
    }

    BY_HANDLE_FILE_INFORMATION info1;
    BY_HANDLE_FILE_INFORMATION info2;
    memset( &info1, 0, sizeof(info1) );
    memset( &info2, 0, sizeof(info2) );

    int got_info = ( GetFileInformationByHandle( fh1, &info1 )
                     && GetFileInformationByHandle( fh2, &info2 ) ) ? 1 : 0;
    CloseHandle(fh1);
    CloseHandle(fh2);
    if ( !got_info )
      return 0;

    //always false for directories:
    if ( info1.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY )
      return 0;
    if ( info2.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY )
      return 0;

    //Now compare index:
    if ( info1.nFileIndexLow != info2.nFileIndexLow )
      return 0;
    if ( info1.nFileIndexHigh != info2.nFileIndexHigh )
      return 0;
    if ( info1.dwVolumeSerialNumber != info2.dwVolumeSerialNumber )
      return 0;
    //Extra checks, added for safety in cases of rare clashes in the above:
    if ( info1.nFileSizeLow != info2.nFileSizeLow )
      return 0;
    if ( info1.nFileSizeHigh != info2.nFileSizeHigh )
      return 0;
    if ( info1.nNumberOfLinks != info2.nNumberOfLinks )
      return 0;
    if ( info1.dwFileAttributes != info2.dwFileAttributes )
      return 0;
    //Finally, look at the creation time:
    if ( CompareFileTime( &info1.ftCreationTime,
                          &info2.ftCreationTime ) != 0 )
      return 0;

    //Must be the same file (even though the two paths might still represent two
    //separate files in the file-system, but hardlinked to the same actual file
    //node).
    return 1;
#else
    //A hopefully bullet proof way, (st_ino,st_dev) uniquely identifies a file
    //on a POSIX system.
    struct stat sinfo1;
    struct stat sinfo2;
    char buf[4096];
    {
      mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &native, &p1 );
      mctools_pathseps_platform( &native );
      FILE * fh = fopen(native.c_str,"rb");
      mcu8str_dealloc(&native);
      if ( !fh )
        return 0;
      if ( fstat(fileno(fh), &sinfo1) != 0 ) {
        fclose(fh);
        return 0;
      }
      fclose(fh);
    }
    if ( S_ISDIR(sinfo1.st_mode) )
      return 0;//always false for directories
    {
      mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &native, &p2 );
      mctools_pathseps_platform( &native );
      FILE * fh = fopen(native.c_str,"rb");
      mcu8str_dealloc(&native);
      if ( !fh )
        return 0;
      if ( fstat(fileno(fh), &sinfo2) != 0 ) {
        fclose(fh);
        return 0;
      }
      fclose(fh);
    }
    if ( S_ISDIR(sinfo2.st_mode) )
      return 0;//always false for directories
    return ( sinfo1.st_dev == sinfo2.st_dev
             && sinfo1.st_ino == sinfo2.st_ino ) ? 1 : 0;
#endif
  }